

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O3

void __thiscall
wasm::MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
          (MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
           *this,Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *u
          )

{
  __index_type _Var1;
  long lVar2;
  undefined8 uVar3;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *pRVar4;
  
  _Var1 = *(__index_type *)
           ((long)&(u->val).
                   super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           + 0x20);
  if (_Var1 == '\x01') {
    *(undefined1 **)
     &(this->val).
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
         = (undefined1 *)
           ((long)&(this->val).
                   super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           + 0x10);
    lVar2 = *(long *)&(u->val).
                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this,lVar2,
               *(long *)((long)&(u->val).
                                super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                .
                                super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                        + 8) + lVar2);
    pRVar4 = (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)0x2
    ;
  }
  else {
    pRVar4 = (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)0x0
    ;
    if (_Var1 != '\0') {
      u = pRVar4;
    }
    uVar3 = *(undefined8 *)
             ((long)&(u->val).
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             + 8);
    *(undefined8 *)
     &(this->val).
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
         = *(undefined8 *)
            &(u->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ;
    *(undefined8 *)
     ((long)&(this->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
     + 8) = uVar3;
  }
  *(__index_type *)
   ((long)&(this->val).
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
   + 0x20) = (__index_type)pRVar4;
  return;
}

Assistant:

MaybeResult(Result<U>&& u)
    : val(u.getErr() ? std::variant<T, None, Err>{*u.getErr()}
                     : std::variant<T, None, Err>{*u}) {}